

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.h
# Opt level: O0

char * strlwr(char *str)

{
  int iVar1;
  char *local_18;
  char *ptr;
  char *str_local;
  
  for (local_18 = str; *local_18 != '\0'; local_18 = local_18 + 1) {
    iVar1 = tolower((int)*local_18);
    *local_18 = (char)iVar1;
  }
  return str;
}

Assistant:

static inline char *strlwr(char *str)
{
	char *ptr = str;
	while(*ptr)
	{
		*ptr = tolower(*ptr);
		++ptr;
	}
	return str;
}